

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_abs16_mips(void *d,void *a,uint32_t desc)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  short sVar4;
  
  uVar2 = desc * 8 & 0xff;
  uVar3 = 0;
  do {
    sVar1 = *(short *)((long)a + uVar3);
    sVar4 = -sVar1;
    if (0 < sVar1) {
      sVar4 = sVar1;
    }
    *(short *)((long)d + uVar3) = sVar4;
    uVar3 = uVar3 + 2;
  } while (uVar3 < uVar2 + 8);
  if ((desc >> 2 & 0xf8) <= uVar2) {
    return;
  }
  helper_gvec_abs16_mips_cold_1();
  return;
}

Assistant:

void HELPER(gvec_abs16)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        int16_t aa = *(int16_t *)((char *)a + i);
        *(int16_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}